

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O3

bool __thiscall Regex::processTerminal(Regex *this,Element *cur_node,ParseData *data)

{
  char cVar1;
  char cVar2;
  Element *pEVar3;
  
  if (cur_node->mType == TYPE_CLASS) {
    cVar2 = cur_node->mClassInvert;
    pEVar3 = cur_node->mChild;
    if (pEVar3 != (Element *)0x0) {
      cVar1 = (data->string)._M_dataplus._M_p[data->cur_pos];
      do {
        if ((bool)cVar2 == false) {
          if ((pEVar3->mTermStartChar <= cVar1) && (cVar1 <= pEVar3->mTermEndChar)) {
            return true;
          }
        }
        else if ((pEVar3->mTermStartChar <= cVar1) && (cVar1 <= pEVar3->mTermEndChar))
        goto LAB_0011d4df;
        pEVar3 = pEVar3->mNext;
      } while (pEVar3 != (Element *)0x0);
    }
  }
  else if (((cur_node->mType != TYPE_TERMINAL) ||
           (cVar1 = (data->string)._M_dataplus._M_p[data->cur_pos], cVar1 < cur_node->mTermStartChar
           )) || (cVar2 = '\x01', cur_node->mTermEndChar < cVar1)) {
LAB_0011d4df:
    cVar2 = '\0';
  }
  return (bool)cVar2;
}

Assistant:

bool	Regex::processTerminal( Element *cur_node, ParseData *data )
{
	if ( cur_node->mType == TYPE_TERMINAL )
	{
		if ( CUR_CHAR >= cur_node->mTermStartChar && CUR_CHAR <= cur_node->mTermEndChar )
			return true;
	}
	else if ( cur_node->mType == TYPE_CLASS )
	{
		bool invert = cur_node->mClassInvert;
		bool match = invert;
		Element *child_node = cur_node->mChild;
		
		while ( child_node != NULL )
		{
			if ( !invert )
			{
				if ( CUR_CHAR >= child_node->mTermStartChar && CUR_CHAR <= child_node->mTermEndChar )
					return true;
			}
			else
			{
				if ( CUR_CHAR >= child_node->mTermStartChar && CUR_CHAR <= child_node->mTermEndChar )
					return false;
			}
			
			child_node = child_node->mNext;
		}
		
		if ( match )
			return true;
		else
			return false;
	}

	return false;
}